

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::array_cs_ext::front(array *arr)

{
  bool bVar1;
  string *str;
  proxy *in_RDI;
  any *in_stack_ffffffffffffff98;
  any *in_stack_ffffffffffffffa0;
  allocator *this;
  allocator local_31;
  string local_30 [48];
  
  bVar1 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::empty
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x25e8c5);
  if (!bVar1) {
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::front
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI);
    any::any(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    return (var)in_RDI;
  }
  str = (string *)__cxa_allocate_exception(0x20);
  this = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Call front() on empty array.",this);
  cs::lang_error::lang_error((lang_error *)this,str);
  __cxa_throw(str,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

var front(const array &arr)
		{
			if (arr.empty())
				throw lang_error("Call front() on empty array.");
			return arr.front();
		}